

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
 __thiscall testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _func_unsigned_long_uchar_ptr_int_unsigned_short_ptr_int_int *p_Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer pTVar8;
  undefined8 *puVar9;
  void *pvVar10;
  undefined8 *puVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar12;
  undefined8 *in_RSI;
  long lVar13;
  ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
  PVar14;
  _Vector_base<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>_>
  local_118;
  undefined8 local_f8 [3];
  undefined4 uStack_e0;
  undefined4 local_dc;
  undefined4 uStack_d8;
  undefined1 auStack_d4 [12];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined4 uStack_b0;
  undefined4 local_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined8 uStack_74;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  
  local_f8[0] = *in_RSI;
  local_f8[1] = in_RSI[1];
  local_f8[2] = in_RSI[2];
  auStack_d4._0_8_ = *(undefined8 *)((long)in_RSI + 0x24);
  uStack_d8 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x1c) >> 0x20);
  uStack_e0 = (undefined4)in_RSI[3];
  local_dc = (undefined4)((ulong)in_RSI[3] >> 0x20);
  local_c8 = in_RSI[6];
  uStack_c0 = in_RSI[7];
  uStack_b8 = in_RSI[8];
  uStack_a4 = *(undefined8 *)((long)in_RSI + 0x54);
  uStack_a8 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x4c) >> 0x20);
  uStack_b0 = (undefined4)in_RSI[9];
  local_ac = (undefined4)((ulong)in_RSI[9] >> 0x20);
  local_98 = in_RSI[0xc];
  uStack_90 = in_RSI[0xd];
  local_88 = in_RSI[0xe];
  uStack_74 = *(undefined8 *)((long)in_RSI + 0x84);
  uStack_80 = (undefined4)in_RSI[0xf];
  uStack_7c = (undefined4)*(undefined8 *)((long)in_RSI + 0x7c);
  uStack_78 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0x7c) >> 0x20);
  local_68 = in_RSI[0x12];
  uStack_60 = in_RSI[0x13];
  uStack_58 = in_RSI[0x14];
  uStack_44 = *(undefined8 *)((long)in_RSI + 0xb4);
  uStack_48 = (undefined4)((ulong)*(undefined8 *)((long)in_RSI + 0xac) >> 0x20);
  uStack_50 = (undefined4)in_RSI[0x15];
  local_4c = (undefined4)((ulong)in_RSI[0x15] >> 0x20);
  local_118._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar8 = (pointer)operator_new(0xc0);
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = pTVar8 + 4;
  uVar12 = 0;
  for (lVar13 = 0;
      local_118._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((long)&pTVar8->log2width + lVar13), lVar13 != 0xc0; lVar13 = lVar13 + 0x30) {
    uVar2 = *(undefined8 *)((long)local_f8 + lVar13);
    uVar3 = *(undefined8 *)((long)local_f8 + lVar13 + 8);
    uVar4 = *(undefined8 *)((long)local_f8 + lVar13 + 0x10);
    p_Var5 = *(_func_unsigned_long_uchar_ptr_int_unsigned_short_ptr_int_int **)
              ((long)&uStack_e0 + lVar13);
    uVar6 = *(undefined8 *)((long)&uStack_d8 + lVar13);
    uVar7 = *(undefined8 *)(auStack_d4 + lVar13 + 4);
    (local_118._M_impl.super__Vector_impl_data._M_finish)->bit_depth = (int)uVar6;
    (local_118._M_impl.super__Vector_impl_data._M_finish)->use_high_bit_depth =
         (bool)(char)((ulong)uVar6 >> 0x20);
    *(int3 *)&(local_118._M_impl.super__Vector_impl_data._M_finish)->field_0x25 =
         (int3)((ulong)uVar6 >> 0x28);
    *(undefined8 *)&(local_118._M_impl.super__Vector_impl_data._M_finish)->mask = uVar7;
    *(undefined8 *)&(local_118._M_impl.super__Vector_impl_data._M_finish)->block_size = uVar4;
    (local_118._M_impl.super__Vector_impl_data._M_finish)->func = p_Var5;
    (local_118._M_impl.super__Vector_impl_data._M_finish)->log2width = (int)uVar2;
    (local_118._M_impl.super__Vector_impl_data._M_finish)->log2height = (int)((ulong)uVar2 >> 0x20);
    (local_118._M_impl.super__Vector_impl_data._M_finish)->width = (int)uVar3;
    (local_118._M_impl.super__Vector_impl_data._M_finish)->height = (int)((ulong)uVar3 >> 0x20);
    uVar12 = uVar12 + 1;
  }
  local_118._M_impl.super__Vector_impl_data._M_start = pTVar8;
  puVar9 = (undefined8 *)operator_new(0x20);
  *puVar9 = &PTR__ValuesInIteratorRangeGenerator_00f68f08;
  puVar9[3] = 0;
  puVar9[1] = 0;
  puVar9[2] = 0;
  if (uVar12 < 0x2aaaaaaaaaaaaab) {
    pvVar10 = operator_new(0xc0);
    puVar9[1] = pvVar10;
    puVar9[3] = (long)pvVar10 + 0xc0;
    for (lVar13 = 0; puVar11 = (undefined8 *)((long)pvVar10 + lVar13), lVar13 != 0xc0;
        lVar13 = lVar13 + 0x30) {
      puVar1 = (undefined8 *)((long)&pTVar8->log2width + lVar13);
      uVar2 = *puVar1;
      uVar3 = puVar1[1];
      uVar4 = puVar1[2];
      uVar6 = puVar1[3];
      uVar7 = puVar1[5];
      puVar11[4] = puVar1[4];
      puVar11[5] = uVar7;
      puVar11[2] = uVar4;
      puVar11[3] = uVar6;
      *puVar11 = uVar2;
      puVar11[1] = uVar3;
    }
    puVar9[2] = puVar11;
    *(undefined8 **)this = puVar9;
    *(undefined8 *)(this + 8) = 0;
    puVar11 = (undefined8 *)operator_new(0x18);
    puVar11[1] = 0x100000001;
    *puVar11 = &PTR___Sp_counted_base_00f68fd0;
    puVar11[2] = puVar9;
    *(undefined8 **)(this + 8) = puVar11;
    std::
    _Vector_base<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>,_std::allocator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>_>
    ::~_Vector_base(&local_118);
    PVar14.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    PVar14.impl_.
    super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (ParamGenerator<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>
            )PVar14.impl_.
             super___shared_ptr<const_testing::internal::ParamGeneratorInterface<(anonymous_namespace)::TestParams<unsigned_long_(*)(unsigned_char_*,_int,_unsigned_short_*,_int,_int)>_>,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }